

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

void __thiscall
Fad<float>::Fad<FadBinaryMul<Fad<float>,Fad<float>>>
          (Fad<float> *this,FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *fadexpr)

{
  int iVar1;
  int csize;
  uint uVar2;
  Fad<float> *pFVar3;
  Fad<float> *pFVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  value_type vVar8;
  
  pFVar3 = (fadexpr->fadexpr_).left_;
  pFVar4 = (fadexpr->fadexpr_).right_;
  this->val_ = pFVar3->val_ * pFVar4->val_;
  iVar1 = (pFVar3->dx_).num_elts;
  csize = (pFVar4->dx_).num_elts;
  if (csize < iVar1) {
    csize = iVar1;
  }
  Vector<float>::Vector(&this->dx_,csize);
  this->defaultVal = 0.0;
  uVar2 = (((fadexpr->fadexpr_).left_)->dx_).num_elts;
  uVar6 = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar6 < (int)uVar2) {
    uVar6 = uVar2;
  }
  if (uVar6 != 0) {
    uVar5 = 0;
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar5;
    }
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      vVar8 = FadBinaryMul<Fad<float>,_Fad<float>_>::dx(&fadexpr->fadexpr_,(int)uVar5);
      (this->dx_).ptr_to_data[uVar5] = vVar8;
    }
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }